

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuserror.cpp
# Opt level: O0

void __thiscall QDBusError::QDBusError(QDBusError *this,ErrorType error,QString *mess)

{
  long lVar1;
  QLatin1String QVar2;
  QLatin1String *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  QString *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_18;
  int in_stack_ffffffffffffffec;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_ESI;
  this_00 = (QString *)(in_RDI + 2);
  QString::QString((QString *)0x15d9e1);
  QString::QString((QString *)0x15d9f3);
  QOffsetStringArray<std::array<char,_1056UL>,_std::array<unsigned_short,_30UL>_>::operator[]
            ((QOffsetStringArray<std::array<char,_1056UL>,_std::array<unsigned_short,_30UL>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffec);
  QLatin1String::QLatin1String(in_RDX,(char *)this_00);
  QVar2.m_size._4_4_ = in_stack_ffffffffffffffec;
  QVar2.m_size._0_4_ = local_18;
  QVar2.m_data = local_10;
  QString::operator=((QString *)(in_RDI + 8),QVar2);
  QString::operator=(this_00,(QString *)in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusError::QDBusError(ErrorType error, const QString &mess)
    : code(error)
{
    nm = QLatin1StringView(errorMessages[error]);
    msg = mess;
}